

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

void * vmd_pool_alloc(vmd_pool_t *pool,size_t s)

{
  size_t sVar1;
  size_t sVar2;
  vmd_pool_chunk_t *pvVar3;
  size_t local_30;
  void *ret;
  vmd_pool_chunk_t *chunk;
  size_t s_local;
  vmd_pool_t *pool_local;
  
  if ((pool->chunk == (vmd_pool_chunk_t *)0x0) || (pool->chunk->free < s)) {
    local_30 = s;
    if (s < 0x201) {
      local_30 = 0x200;
    }
    pvVar3 = alloc_chunk(local_30);
    pvVar3->next = pool->chunk;
    pool->chunk = pvVar3;
  }
  pvVar3 = pool->chunk;
  sVar1 = pool->chunk->size;
  sVar2 = pool->chunk->free;
  pool->chunk->free = pool->chunk->free - s;
  return (void *)((long)pvVar3 + ((sVar1 + 0x18) - sVar2));
}

Assistant:

void *
pool_alloc(pool_t *pool, size_t s)
{
	if (pool->chunk == NULL || pool->chunk->free < s ) {
		pool_chunk_t *chunk = alloc_chunk(MAX(512, s));
		chunk->next = pool->chunk;
		pool->chunk = chunk;
	}

	void *ret = pool->chunk->data + pool->chunk->size - pool->chunk->free;
	pool->chunk->free -= s;
	return ret;
}